

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reusable_node.h
# Opt level: O1

_Bool reusable_node_descend(ReusableNode *self)

{
  uint32_t uVar1;
  SubtreeHeapData *pSVar2;
  long lVar3;
  undefined1 uVar4;
  StackEntry *pSVar5;
  ulong uVar6;
  uint uVar7;
  ulong extraout_RDX;
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  ushort uVar11;
  uint uVar12;
  size_t __size;
  _Bool _Var13;
  
  uVar12 = (self->stack).size;
  if (uVar12 == 0) {
    __assert_fail("(uint32_t)(&self->stack)->size - 1 < (&self->stack)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/reusable_node.h"
                  ,0x48,"_Bool reusable_node_descend(ReusableNode *)");
  }
  pSVar5 = (self->stack).contents;
  pSVar2 = pSVar5[uVar12 - 1].tree.ptr;
  if (((ulong)pSVar2 & 1) == 0) {
    _Var13 = pSVar2->child_count != 0;
  }
  else {
    _Var13 = false;
  }
  if (_Var13 == false) {
    return false;
  }
  uVar1 = pSVar5[uVar12 - 1].byte_offset;
  uVar7 = (self->stack).capacity;
  uVar6 = (ulong)uVar7;
  if (uVar12 != uVar7) goto LAB_00138063;
  uVar12 = 8;
  if (8 < uVar7 * 2) {
    uVar12 = uVar7 * 2;
  }
  if (uVar12 <= uVar7) goto LAB_00138063;
  __size = (size_t)uVar12;
  if (pSVar5 == (StackEntry *)0x0) {
LAB_0013804a:
    uVar7 = 0x10;
    pSVar5 = (StackEntry *)calloc(__size,0x10);
    if (pSVar5 == (StackEntry *)0x0) {
      reusable_node_descend_cold_2();
      lVar3 = *(long *)(*(long *)(__size + 0x4d0) + 0x38);
      if ((extraout_RDX & 1) == 0) {
        if (*(int *)(extraout_RDX + 0x24) == 0) {
          uVar8 = *(ushort *)(extraout_RDX + 0x28);
        }
        else {
          uVar8 = *(ushort *)(extraout_RDX + 0x4e);
        }
      }
      else {
        uVar8 = (ushort)(byte)(extraout_RDX >> 8);
      }
      uVar12 = *(uint *)(lVar3 + (ulong)uVar7 * 4);
      uVar9 = (ushort)(extraout_RDX >> 0x30);
      uVar11 = uVar9;
      if ((extraout_RDX & 1) == 0) {
        if (*(int *)(extraout_RDX + 0x24) == 0) {
          uVar11 = *(ushort *)(extraout_RDX + 0x2a);
        }
        else {
          uVar11 = *(ushort *)(extraout_RDX + 0x50);
        }
      }
      if (*(uint *)(lVar3 + (ulong)uVar11 * 4) == uVar12) {
        if (uVar8 != *(ushort *)(*(long *)(__size + 0x4d0) + 0x60)) {
          return true;
        }
        if ((extraout_RDX & 1) == 0) {
          uVar10 = *(uint *)(extraout_RDX + 0x2c) >> 8;
        }
        else {
          uVar10 = (uint)(extraout_RDX >> 6) & 0x3ffffff;
        }
        if ((uVar10 & 1) == 0) {
          if ((extraout_RDX & 1) == 0) {
            uVar9 = *(ushort *)(extraout_RDX + 0x2a);
          }
          if (uVar9 == (ushort)uVar7) {
            return true;
          }
        }
      }
      if ((extraout_RDX & 1) == 0) {
        uVar7 = *(uint *)(extraout_RDX + 0x10);
      }
      else {
        uVar7 = (uint)extraout_RDX >> 0x18;
      }
      uVar4 = 0;
      if ((uVar8 == 0 || uVar7 != 0) && (uVar4 = 0, uVar12 < 0x10000)) {
        uVar4 = *(undefined1 *)(uVar6 + 0xc);
      }
      return (_Bool)uVar4;
    }
  }
  else {
    __size = __size << 4;
    pSVar5 = (StackEntry *)realloc(pSVar5,__size);
    if (pSVar5 == (StackEntry *)0x0) {
      reusable_node_descend_cold_1();
      goto LAB_0013804a;
    }
  }
  (self->stack).contents = pSVar5;
  (self->stack).capacity = uVar12;
LAB_00138063:
  pSVar5 = (self->stack).contents;
  uVar12 = (self->stack).size;
  (self->stack).size = uVar12 + 1;
  pSVar5[uVar12].tree = *(pSVar2->field_17).field_0.children;
  pSVar5[uVar12].child_index = 0;
  pSVar5[uVar12].byte_offset = uVar1;
  return _Var13;
}

Assistant:

static inline bool reusable_node_descend(ReusableNode *self) {
  StackEntry last_entry = *array_back(&self->stack);
  if (ts_subtree_child_count(last_entry.tree) > 0) {
    array_push(&self->stack, ((StackEntry) {
      .tree = last_entry.tree.ptr->children[0],
      .child_index = 0,
      .byte_offset = last_entry.byte_offset,
    }));
    return true;
  } else {
    return false;
  }
}